

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_SetFlagValueTest_OrdinaryValues::Run(void)

{
  bool bVar1;
  char *pcVar2;
  FlagSettingMode in_R8D;
  char *pcVar3;
  FlagSaver fs;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","SetFlagValueTest","OrdinaryValues");
  bVar1 = std::operator==("initial",fLS::FLAGS_test_str1_abi_cxx11_);
  if (bVar1) {
    SetCommandLineOptionWithMode_abi_cxx11_
              (&local_28,(gflags *)0x14b427,"second",(char *)0x1,in_R8D);
    std::__cxx11::string::~string((string *)&local_28);
    bVar1 = std::operator==("second",fLS::FLAGS_test_str1_abi_cxx11_);
    if (bVar1) {
      SetCommandLineOptionWithMode_abi_cxx11_
                (&local_48,(gflags *)0x14b427,"third",(char *)0x1,in_R8D);
      std::__cxx11::string::~string((string *)&local_48);
      bVar1 = std::operator==("second",fLS::FLAGS_test_str1_abi_cxx11_);
      if (bVar1) {
        std::__cxx11::string::assign((char *)fLS::FLAGS_test_str1_abi_cxx11_);
        SetCommandLineOptionWithMode_abi_cxx11_
                  (&local_68,(gflags *)0x14b427,"third",(char *)0x1,in_R8D);
        std::__cxx11::string::~string((string *)&local_68);
        bVar1 = std::operator==("initial",fLS::FLAGS_test_str1_abi_cxx11_);
        if (!bVar1) goto LAB_00134340;
        SetCommandLineOptionWithMode_abi_cxx11_
                  (&local_88,(gflags *)0x14b427,"third",(char *)0x0,in_R8D);
        std::__cxx11::string::~string((string *)&local_88);
        bVar1 = std::operator==("third",fLS::FLAGS_test_str1_abi_cxx11_);
        if (bVar1) {
          SetCommandLineOptionWithMode_abi_cxx11_
                    (&local_a8,(gflags *)0x14b427,"fourth",(char *)0x2,in_R8D);
          std::__cxx11::string::~string((string *)&local_a8);
          bVar1 = std::operator==("third",fLS::FLAGS_test_str1_abi_cxx11_);
          if (bVar1) {
            bVar1 = std::operator==("initial",fLS::FLAGS_test_str2_abi_cxx11_);
            if (bVar1) {
              SetCommandLineOptionWithMode_abi_cxx11_
                        (&local_c8,(gflags *)0x14b45c,"second",(char *)0x2,in_R8D);
              std::__cxx11::string::~string((string *)&local_c8);
              bVar1 = std::operator==("second",fLS::FLAGS_test_str2_abi_cxx11_);
              if (bVar1) {
                std::__cxx11::string::assign((char *)fLS::FLAGS_test_str2_abi_cxx11_);
                bVar1 = std::operator==("extra",fLS::FLAGS_test_str2_abi_cxx11_);
                if (bVar1) {
                  std::__cxx11::string::assign((char *)fLS::FLAGS_test_str2_abi_cxx11_);
                  SetCommandLineOptionWithMode_abi_cxx11_
                            (&local_e8,(gflags *)0x14b45c,"third",(char *)0x2,in_R8D);
                  std::__cxx11::string::~string((string *)&local_e8);
                  bVar1 = std::operator==("third",fLS::FLAGS_test_str2_abi_cxx11_);
                  if (bVar1) {
                    SetCommandLineOptionWithMode_abi_cxx11_
                              (&local_108,(gflags *)0x14b45c,"fourth",(char *)0x1,in_R8D);
                    std::__cxx11::string::~string((string *)&local_108);
                    bVar1 = std::operator==("fourth",fLS::FLAGS_test_str2_abi_cxx11_);
                    if (bVar1) {
                      bVar1 = std::operator==("initial",fLS::FLAGS_test_str3_abi_cxx11_);
                      if (bVar1) {
                        SetCommandLineOptionWithMode_abi_cxx11_
                                  (&local_128,(gflags *)0x14b483,"second",(char *)0x2,in_R8D);
                        std::__cxx11::string::~string((string *)&local_128);
                        bVar1 = std::operator==("second",fLS::FLAGS_test_str3_abi_cxx11_);
                        if (bVar1) {
                          std::__cxx11::string::assign((char *)fLS::FLAGS_test_str3_abi_cxx11_);
                          SetCommandLineOptionWithMode_abi_cxx11_
                                    (&local_148,(gflags *)0x14b483,"fourth",(char *)0x2,in_R8D);
                          std::__cxx11::string::~string((string *)&local_148);
                          bVar1 = std::operator==("third",fLS::FLAGS_test_str3_abi_cxx11_);
                          if (bVar1) {
                            SetCommandLineOptionWithMode_abi_cxx11_
                                      (&local_168,(gflags *)0x14b483,"fourth",(char *)0x1,in_R8D);
                            std::__cxx11::string::~string((string *)&local_168);
                            bVar1 = std::operator==("third",fLS::FLAGS_test_str3_abi_cxx11_);
                            if (bVar1) {
                              SetCommandLineOptionWithMode_abi_cxx11_
                                        (&local_188,(gflags *)0x14b483,"fourth",(char *)0x0,in_R8D);
                              std::__cxx11::string::~string((string *)&local_188);
                              bVar1 = std::operator==("fourth",fLS::FLAGS_test_str3_abi_cxx11_);
                              if (bVar1) {
                                FlagSaver::~FlagSaver(&fs);
                                return;
                              }
                              pcVar2 = "\"fourth\"";
                              goto LAB_00134431;
                            }
                          }
                          pcVar2 = "\"third\"";
                        }
                        else {
                          pcVar2 = "\"second\"";
                        }
                      }
                      else {
                        pcVar2 = "\"initial\"";
                      }
LAB_00134431:
                      pcVar3 = "FLAGS_test_str3";
                      goto LAB_0013443f;
                    }
                    pcVar2 = "\"fourth\"";
                  }
                  else {
                    pcVar2 = "\"third\"";
                  }
                }
                else {
                  pcVar2 = "\"extra\"";
                }
              }
              else {
                pcVar2 = "\"second\"";
              }
            }
            else {
              pcVar2 = "\"initial\"";
            }
            pcVar3 = "FLAGS_test_str2";
            goto LAB_0013443f;
          }
        }
        pcVar2 = "\"third\"";
        goto LAB_00134364;
      }
    }
    pcVar2 = "\"second\"";
  }
  else {
LAB_00134340:
    pcVar2 = "\"initial\"";
  }
LAB_00134364:
  pcVar3 = "FLAGS_test_str1";
LAB_0013443f:
  fprintf(_stderr,"Check failed: %s %s %s\n",pcVar2,"==",pcVar3);
  exit(1);
}

Assistant:

TEST(SetFlagValueTest, OrdinaryValues) {
  EXPECT_EQ("initial", FLAGS_test_str1);

  SetCommandLineOptionWithMode("test_str1", "second", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ("second", FLAGS_test_str1);  // set; was default

  SetCommandLineOptionWithMode("test_str1", "third", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ("second", FLAGS_test_str1);  // already set once

  FLAGS_test_str1 = "initial";
  SetCommandLineOptionWithMode("test_str1", "third", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ("initial", FLAGS_test_str1);  // still already set before

  SetCommandLineOptionWithMode("test_str1", "third", SET_FLAGS_VALUE);
  EXPECT_EQ("third", FLAGS_test_str1);  // changed value

  SetCommandLineOptionWithMode("test_str1", "fourth", SET_FLAGS_DEFAULT);
  EXPECT_EQ("third", FLAGS_test_str1);
  // value not changed (already set before)

  EXPECT_EQ("initial", FLAGS_test_str2);

  SetCommandLineOptionWithMode("test_str2", "second", SET_FLAGS_DEFAULT);
  EXPECT_EQ("second", FLAGS_test_str2);  // changed (was default)

  FLAGS_test_str2 = "extra";
  EXPECT_EQ("extra", FLAGS_test_str2);

  FLAGS_test_str2 = "second";
  SetCommandLineOptionWithMode("test_str2", "third", SET_FLAGS_DEFAULT);
  EXPECT_EQ("third", FLAGS_test_str2);  // still changed (was equal to default)

  SetCommandLineOptionWithMode("test_str2", "fourth", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ("fourth", FLAGS_test_str2);  // changed (was default)

  EXPECT_EQ("initial", FLAGS_test_str3);

  SetCommandLineOptionWithMode("test_str3", "second", SET_FLAGS_DEFAULT);
  EXPECT_EQ("second", FLAGS_test_str3);  // changed

  FLAGS_test_str3 = "third";
  SetCommandLineOptionWithMode("test_str3", "fourth", SET_FLAGS_DEFAULT);
  EXPECT_EQ("third", FLAGS_test_str3);  // not changed (was set)

  SetCommandLineOptionWithMode("test_str3", "fourth", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ("third", FLAGS_test_str3);  // not changed (was set)

  SetCommandLineOptionWithMode("test_str3", "fourth", SET_FLAGS_VALUE);
  EXPECT_EQ("fourth", FLAGS_test_str3);  // changed value
}